

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_hashmap.h
# Opt level: O2

int __thiscall
v_hashmap<unsigned_long,_features>::init(v_hashmap<unsigned_long,_features> *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  _func_bool_unsigned_long_ptr_unsigned_long_ptr *in_RCX;
  long lVar1;
  undefined1 *in_RDX;
  features *pfVar2;
  byte bVar3;
  
  bVar3 = 0;
  if (ctx < (EVP_PKEY_CTX *)0x400) {
    ctx = (EVP_PKEY_CTX *)0x3ff;
  }
  v_array<v_hashmap<unsigned_long,_features>::hash_elem>::resize(&this->dat,(size_t)ctx);
  pfVar2 = &this->default_value;
  for (lVar1 = 100; lVar1 != 0; lVar1 = lVar1 + -1) {
    *(undefined1 *)&(pfVar2->values)._begin = *in_RDX;
    in_RDX = in_RDX + (ulong)bVar3 * -2 + 1;
    pfVar2 = (features *)((long)pfVar2 + (ulong)bVar3 * -2 + 1);
  }
  this->equivalent = (_func_bool_void_ptr_unsigned_long_ptr_unsigned_long_ptr *)0x0;
  this->equivalent_no_data = in_RCX;
  this->last_position = 0;
  this->num_occupants = 0;
  this->eq_data = (void *)0x0;
  return extraout_EAX;
}

Assistant:

void init(size_t min_size, const V& def, bool (*eq)(const K&, const K&))
  {
    if (min_size < 1023)
      min_size = 1023;
    dat.resize(min_size);  // resize sets to 0 ==> occupied=false

    default_value = def;
    equivalent = nullptr;
    equivalent_no_data = eq;
    eq_data = nullptr;

    last_position = 0;
    num_occupants = 0;
  }